

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O2

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary_vertex_chunk
          (_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *_opt,bool _swap)

{
  undefined1 *puVar1;
  ChunkHeader CVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  mostream *pmVar6;
  size_t sVar7;
  undefined4 extraout_var;
  BaseProperty *_bp;
  ulong uVar8;
  size_type *local_70;
  PropertyName custom_prop;
  Vec3f v3f;
  Vec2f v2f;
  Vec3uc v3uc;
  
  CVar2 = this->chunk_header_;
  unique0x100006cd = (BaseImporter *)_opt;
  if (((uint)CVar2 & 0x1c) != 0) {
    __assert_fail("chunk_header_.entity_ == Chunk::Entity_Vertex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                  ,0x119,
                  "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                 );
  }
  local_70 = &custom_prop.super_string._M_string_length;
  custom_prop.super_string._M_dataplus._M_p = (pointer)0x0;
  custom_prop.super_string._M_string_length._0_1_ = 0;
  switch((uint)CVar2 >> 5 & 0xf) {
  case 0:
    unique0x100006c5 = _bi;
    if (((uint)CVar2 & 0x3800) != 0x1000) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x124,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    uVar8 = 0;
    puVar1 = (undefined1 *)((long)&custom_prop.super_string.field_2 + 8);
    while ((uVar5 = (ulong)(this->header_).n_vertices_, uVar8 < uVar5 &&
           (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) == 0))) {
      sVar7 = restore<OpenMesh::VectorT<float,3>>(_is,puVar1,_swap);
      this->bytes_ = this->bytes_ + sVar7;
      (*stack0xffffffffffffffc8->_vptr_BaseImporter[2])(stack0xffffffffffffffc8,puVar1);
      uVar8 = uVar8 + 1;
    }
    break;
  case 1:
    if (((uint)CVar2 & 0x3800) != 0x1000) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x12d,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    *(byte *)&(this->fileOptions_).flags_ = (byte)(this->fileOptions_).flags_ | 0x10;
    uVar8 = 0;
    while ((uVar5 = (ulong)(this->header_).n_vertices_, uVar8 < uVar5 &&
           (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) == 0))) {
      sVar7 = restore<OpenMesh::VectorT<float,3>>
                        (_is,(undefined1 *)((long)&custom_prop.super_string.field_2 + 8),_swap);
      this->bytes_ = this->bytes_ + sVar7;
      if ((((this->fileOptions_).flags_ & 0x10) != 0) &&
         (((ulong)stack0xffffffffffffffc8->_vptr_BaseImporter & 0x10) != 0)) {
        (*_bi->_vptr_BaseImporter[8])
                  (_bi,uVar8 & 0xffffffff,
                   (undefined1 *)((long)&custom_prop.super_string.field_2 + 8));
      }
      uVar8 = uVar8 + 1;
    }
    break;
  case 2:
    if (((uint)CVar2 & 0x3800) != 0x800) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec2f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x138,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    *(byte *)&(this->fileOptions_).flags_ = (byte)(this->fileOptions_).flags_ | 0x40;
    uVar8 = 0;
    while ((uVar5 = (ulong)(this->header_).n_vertices_, uVar8 < uVar5 &&
           (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) == 0))) {
      sVar7 = restore<OpenMesh::VectorT<float,2>>
                        (_is,v3f.super_VectorDataT<float,_3>.values_ + 1,_swap);
      this->bytes_ = this->bytes_ + sVar7;
      if ((((this->fileOptions_).flags_ & 0x40) != 0) &&
         (((ulong)stack0xffffffffffffffc8->_vptr_BaseImporter & 0x40) != 0)) {
        (*_bi->_vptr_BaseImporter[0xd])
                  (_bi,uVar8 & 0xffffffff,v3f.super_VectorDataT<float,_3>.values_ + 1);
      }
      uVar8 = uVar8 + 1;
    }
    break;
  default:
    pmVar6 = omerr();
    std::operator<<(&pmVar6->super_ostream,"Unknown chunk type ignored!\n");
    uVar3 = (this->header_).n_vertices_;
    sVar7 = OMFormat::vector_size(&this->chunk_header_);
    std::istream::ignore((long)_is);
    this->bytes_ = this->bytes_ + sVar7 * uVar3;
    uVar5 = (ulong)(this->header_).n_vertices_;
    uVar8 = 0;
    break;
  case 4:
    if (((uint)CVar2 & 0x3800) != 0x1000) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x144,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    *(byte *)&(this->fileOptions_).flags_ = (byte)(this->fileOptions_).flags_ | 0x20;
    uVar8 = 0;
    while ((uVar5 = (ulong)(this->header_).n_vertices_, uVar8 < uVar5 &&
           (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) == 0))) {
      sVar7 = restore<OpenMesh::VectorT<unsigned_char,3>>
                        (_is,(undefined1 *)((long)v2f.super_VectorDataT<float,_2>.values_ + 1),_swap
                        );
      this->bytes_ = this->bytes_ + sVar7;
      if ((((this->fileOptions_).flags_ & 0x20) != 0) &&
         (((ulong)stack0xffffffffffffffc8->_vptr_BaseImporter & 0x20) != 0)) {
        (*_bi->_vptr_BaseImporter[9])
                  (_bi,uVar8 & 0xffffffff,
                   (undefined1 *)((long)v2f.super_VectorDataT<float,_2>.values_ + 1));
      }
      uVar8 = uVar8 + 1;
    }
    break;
  case 6:
    iVar4 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    _bp = PropertyContainer::property
                    ((PropertyContainer *)(CONCAT44(extraout_var,iVar4) + 8),
                     &(this->property_name_).super_string);
    sVar7 = restore_binary_custom_data(this,_is,_bp,(ulong)(this->header_).n_vertices_,_swap);
    this->bytes_ = this->bytes_ + sVar7;
    uVar5 = (ulong)(this->header_).n_vertices_;
    uVar8 = uVar5;
  }
  std::__cxx11::string::~string((string *)&local_70);
  return uVar8 == uVar5;
}

Assistant:

bool _OMReader_::read_binary_vertex_chunk(std::istream &_is, BaseImporter &_bi, Options &_opt, bool _swap) const
{
  using OMFormat::Chunk;

  assert( chunk_header_.entity_ == Chunk::Entity_Vertex);

  OpenMesh::Vec3f v3f;
  OpenMesh::Vec2f v2f;
  OpenMesh::Vec3uc v3uc; // rgb

  OMFormat::Chunk::PropertyName custom_prop;

  size_t vidx = 0;
  switch (chunk_header_.type_) {
    case Chunk::Type_Pos:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim()));

      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3f, _swap);
        _bi.add_vertex(v3f);
      }
      break;

    case Chunk::Type_Normal:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim()));

      fileOptions_ += Options::VertexNormal;
      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3f, _swap);
        if (fileOptions_.vertex_has_normal() && _opt.vertex_has_normal())
          _bi.set_normal(VertexHandle(int(vidx)), v3f);
      }
      break;

    case Chunk::Type_Texcoord:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec2f::dim()));

      fileOptions_ += Options::VertexTexCoord;
      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v2f, _swap);
        if (fileOptions_.vertex_has_texcoord() && _opt.vertex_has_texcoord())
          _bi.set_texcoord(VertexHandle(int(vidx)), v2f);
      }
      break;

    case Chunk::Type_Color:

      assert( OMFormat::dimensions(chunk_header_) == 3);

      fileOptions_ += Options::VertexColor;

      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3uc, _swap);
        if (fileOptions_.vertex_has_color() && _opt.vertex_has_color())
          _bi.set_color(VertexHandle(int(vidx)), v3uc);
      }
      break;

    case Chunk::Type_Custom:

      bytes_ += restore_binary_custom_data(_is, _bi.kernel()->_get_vprop(property_name_), header_.n_vertices_, _swap);

      vidx = header_.n_vertices_;

      break;

    default: // skip unknown chunks
    {
      omerr() << "Unknown chunk type ignored!\n";
      size_t size_of = header_.n_vertices_ * OMFormat::vector_size(chunk_header_);
      _is.ignore(size_of);
      bytes_ += size_of;
    }
  }

  // all chunk data has been read..?!
  return vidx == header_.n_vertices_;
}